

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.h
# Opt level: O0

InterpFilterParams * av1_get_filter(int subpel_search)

{
  int subpel_search_local;
  InterpFilterParams *local_8;
  
  if (subpel_search == 1) {
    local_8 = av1_interp_4tap + 3;
  }
  else if (subpel_search == 2) {
    local_8 = av1_interp_4tap;
  }
  else if (subpel_search == 3) {
    local_8 = av1_interp_filter_params_list;
  }
  else {
    local_8 = (InterpFilterParams *)0x0;
  }
  return local_8;
}

Assistant:

static inline const InterpFilterParams *av1_get_filter(int subpel_search) {
  assert(subpel_search >= USE_2_TAPS);

  switch (subpel_search) {
    case USE_2_TAPS: return &av1_interp_4tap[BILINEAR];
    case USE_4_TAPS: return &av1_interp_4tap[EIGHTTAP_REGULAR];
    case USE_8_TAPS: return &av1_interp_filter_params_list[EIGHTTAP_REGULAR];
    default: assert(0); return NULL;
  }
}